

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void hash_generate(cf_chash *H,uint8_t *data,size_t ndata,void *out,size_t nout)

{
  size_t local_1f8;
  size_t take;
  void *pvStack_1e0;
  uint8_t one;
  uint8_t *bout;
  uint8_t w [64];
  cf_chash_ctx ctx;
  size_t nout_local;
  void *out_local;
  size_t ndata_local;
  uint8_t *data_local;
  cf_chash *H_local;
  
  take._7_1_ = 1;
  pvStack_1e0 = out;
  ctx._352_8_ = nout;
  while (ctx._352_8_ != 0) {
    (*H->init)(w + 0x38);
    (*H->update)(w + 0x38,data,ndata);
    (*H->digest)(w + 0x38,(uint8_t *)&bout);
    if (H->hashsz < (ulong)ctx._352_8_) {
      local_1f8 = H->hashsz;
    }
    else {
      local_1f8 = ctx._352_8_;
    }
    memcpy(pvStack_1e0,&bout,local_1f8);
    pvStack_1e0 = (void *)(local_1f8 + (long)pvStack_1e0);
    ctx._352_8_ = ctx._352_8_ - local_1f8;
    add(data,ndata,(uint8_t *)((long)&take + 7),1);
  }
  return;
}

Assistant:

static void hash_generate(const cf_chash *H,
                          uint8_t *data, size_t ndata, /* initialised with V */
                          void *out, size_t nout)
{
  cf_chash_ctx ctx;
  uint8_t w[CF_MAXHASH];
  uint8_t *bout = out;
  uint8_t one = 1;

  while (nout)
  {
    /* 4.1. w = Hash(data) */
    H->init(&ctx);
    H->update(&ctx, data, ndata);
    H->digest(&ctx, w);

    /* 4.2. W = W || w */
    size_t take = MIN(H->hashsz, nout);
    memcpy(bout, w, take);
    bout += take;
    nout -= take;

    /* 4.3. data = (data + 1) mod 2 ^ seedlen */
    add(data, ndata, &one, sizeof one);
  }
}